

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk2dfd.c
# Opt level: O1

uint32_t * vk2dfd(VkFormat format)

{
  uint32_t *puVar1;
  int *channels_00;
  int *bits_00;
  int *piVar2;
  int iVar3;
  int iVar4;
  VkCompScheme compScheme;
  int iVar5;
  VkSuffix VVar6;
  int bits [2];
  int channels [2];
  int shiftBits [4];
  int position_ys [4];
  int position_xs [4];
  
  channels_00 = bits;
  piVar2 = bits;
  bits_00 = bits;
  puVar1 = (uint32_t *)0x0;
  if (0x3b9d2b5f < (int)format) {
    if (0x3b9ffa1f < (int)format) {
      if (0x3ba1de7f < (int)format) {
        if (format == VK_FORMAT_R16G16_S10_5_NV) {
          iVar5 = 2;
          iVar4 = 2;
          iVar3 = 0;
          VVar6 = s_SFIXED5;
          goto LAB_001d1d27;
        }
        if (format != VK_FORMAT_A1B5G5R5_UNORM_PACK16_KHR) {
          if (format != VK_FORMAT_A8_UNORM_KHR) {
            return (uint32_t *)0x0;
          }
          puVar1 = createDFDAlpha(0,1,s_UNORM);
          return puVar1;
        }
        channels[0] = 0;
        goto LAB_001d0f96;
      }
      if (format == VK_FORMAT_A4R4G4B4_UNORM_PACK16) {
        channels[0] = 2;
        channels[1] = 1;
      }
      else {
        if (format != VK_FORMAT_A4B4G4R4_UNORM_PACK16) {
          return (uint32_t *)0x0;
        }
        channels[0] = 0;
        channels[1] = 1;
      }
      goto LAB_001d0f7e;
    }
    switch(format) {
    case VK_FORMAT_ASTC_3x3x3_UNORM_BLOCK_EXT:
      iVar5 = 3;
      goto LAB_001d2078;
    case VK_FORMAT_ASTC_3x3x3_SRGB_BLOCK_EXT:
      iVar5 = 3;
      goto LAB_001d209d;
    case VK_FORMAT_ASTC_3x3x3_SFLOAT_BLOCK_EXT:
      iVar5 = 3;
      goto LAB_001d20de;
    case VK_FORMAT_ASTC_4x3x3_UNORM_BLOCK_EXT:
      iVar5 = 4;
LAB_001d2078:
      iVar4 = 3;
LAB_001d210c:
      compScheme = c_ASTC;
      iVar3 = 3;
      goto LAB_001d1b70;
    case VK_FORMAT_ASTC_4x3x3_SRGB_BLOCK_EXT:
      iVar5 = 4;
LAB_001d209d:
      iVar4 = 3;
LAB_001d20a2:
      compScheme = c_ASTC;
      iVar3 = 3;
      goto LAB_001d1b19;
    case VK_FORMAT_ASTC_4x3x3_SFLOAT_BLOCK_EXT:
      iVar5 = 4;
LAB_001d20de:
      iVar4 = 3;
LAB_001d2157:
      compScheme = c_ASTC;
      iVar3 = 3;
      goto LAB_001d1849;
    case VK_FORMAT_ASTC_4x4x3_UNORM_BLOCK_EXT:
      iVar5 = 4;
      iVar4 = 4;
      goto LAB_001d210c;
    case VK_FORMAT_ASTC_4x4x3_SRGB_BLOCK_EXT:
      iVar5 = 4;
      iVar4 = 4;
      goto LAB_001d20a2;
    case VK_FORMAT_ASTC_4x4x3_SFLOAT_BLOCK_EXT:
      iVar5 = 4;
      iVar4 = 4;
      goto LAB_001d2157;
    case VK_FORMAT_ASTC_4x4x4_UNORM_BLOCK_EXT:
      iVar5 = 4;
      goto LAB_001d2017;
    case VK_FORMAT_ASTC_4x4x4_SRGB_BLOCK_EXT:
      iVar5 = 4;
      goto LAB_001d2139;
    case VK_FORMAT_ASTC_4x4x4_SFLOAT_BLOCK_EXT:
      iVar5 = 4;
      goto LAB_001d1fe8;
    case VK_FORMAT_ASTC_5x4x4_UNORM_BLOCK_EXT:
      iVar5 = 5;
LAB_001d2017:
      iVar4 = 4;
LAB_001d2064:
      compScheme = c_ASTC;
      iVar3 = 4;
      goto LAB_001d1b70;
    case VK_FORMAT_ASTC_5x4x4_SRGB_BLOCK_EXT:
      iVar5 = 5;
LAB_001d2139:
      iVar4 = 4;
LAB_001d213e:
      compScheme = c_ASTC;
      iVar3 = 4;
      goto LAB_001d1b19;
    case VK_FORMAT_ASTC_5x4x4_SFLOAT_BLOCK_EXT:
      iVar5 = 5;
LAB_001d1fe8:
      iVar4 = 4;
LAB_001d20bb:
      compScheme = c_ASTC;
      iVar3 = 4;
      goto LAB_001d1849;
    case VK_FORMAT_ASTC_5x5x4_UNORM_BLOCK_EXT:
      iVar5 = 5;
      iVar4 = 5;
      goto LAB_001d2064;
    case VK_FORMAT_ASTC_5x5x4_SRGB_BLOCK_EXT:
      iVar5 = 5;
      iVar4 = 5;
      goto LAB_001d213e;
    case VK_FORMAT_ASTC_5x5x4_SFLOAT_BLOCK_EXT:
      iVar5 = 5;
      iVar4 = 5;
      goto LAB_001d20bb;
    case VK_FORMAT_ASTC_5x5x5_UNORM_BLOCK_EXT:
      iVar5 = 5;
      goto LAB_001d2120;
    case VK_FORMAT_ASTC_5x5x5_SRGB_BLOCK_EXT:
      iVar5 = 5;
      goto LAB_001d2177;
    case VK_FORMAT_ASTC_5x5x5_SFLOAT_BLOCK_EXT:
      iVar5 = 5;
      goto LAB_001d2190;
    case VK_FORMAT_ASTC_6x5x5_UNORM_BLOCK_EXT:
      iVar5 = 6;
LAB_001d2120:
      iVar4 = 5;
LAB_001d2125:
      compScheme = c_ASTC;
      iVar3 = 5;
      goto LAB_001d1b70;
    case VK_FORMAT_ASTC_6x5x5_SRGB_BLOCK_EXT:
      iVar5 = 6;
LAB_001d2177:
      iVar4 = 5;
LAB_001d217c:
      compScheme = c_ASTC;
      iVar3 = 5;
      goto LAB_001d1b19;
    case VK_FORMAT_ASTC_6x5x5_SFLOAT_BLOCK_EXT:
      iVar5 = 6;
LAB_001d2190:
      iVar4 = 5;
LAB_001d21d8:
      compScheme = c_ASTC;
      iVar3 = 5;
      goto LAB_001d1849;
    case VK_FORMAT_ASTC_6x6x5_UNORM_BLOCK_EXT:
      iVar5 = 6;
      iVar4 = 6;
      goto LAB_001d2125;
    case VK_FORMAT_ASTC_6x6x5_SRGB_BLOCK_EXT:
      iVar5 = 6;
      iVar4 = 6;
      goto LAB_001d217c;
    case VK_FORMAT_ASTC_6x6x5_SFLOAT_BLOCK_EXT:
      iVar5 = 6;
      iVar4 = 6;
      goto LAB_001d21d8;
    case VK_FORMAT_ASTC_6x6x6_UNORM_BLOCK_EXT:
      compScheme = c_ASTC;
      iVar5 = 6;
      iVar4 = 6;
      iVar3 = 6;
      goto LAB_001d1b70;
    case VK_FORMAT_ASTC_6x6x6_SRGB_BLOCK_EXT:
      compScheme = c_ASTC;
      iVar5 = 6;
      iVar4 = 6;
      iVar3 = 6;
      goto LAB_001d1b19;
    case VK_FORMAT_ASTC_6x6x6_SFLOAT_BLOCK_EXT:
      compScheme = c_ASTC;
      iVar5 = 6;
      iVar4 = 6;
      iVar3 = 6;
      goto LAB_001d1849;
    }
    switch(format) {
    case VK_FORMAT_G8B8G8R8_422_UNORM:
      bits[0] = 8;
      bits[1] = 8;
      goto LAB_001d1f1d;
    case VK_FORMAT_B8G8R8G8_422_UNORM:
      bits[0] = 8;
      bits[1] = 8;
      goto LAB_001d1e08;
    default:
      return (uint32_t *)0x0;
    case VK_FORMAT_R10X6_UNORM_PACK16:
      bits[0] = 10;
      shiftBits[0] = 6;
      goto LAB_001d1e33;
    case VK_FORMAT_R10X6G10X6_UNORM_2PACK16:
      bits[0] = 10;
      bits[1] = 10;
      shiftBits[0] = 6;
      shiftBits[1] = 6;
      goto LAB_001d1ef2;
    case VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16:
      bits[0] = 10;
      bits[1] = 10;
      shiftBits[0] = 6;
      shiftBits[1] = 6;
      shiftBits[2] = 6;
      shiftBits[3] = 6;
      goto LAB_001d1f89;
    case VK_FORMAT_G10X6B10X6G10X6R10X6_422_UNORM_4PACK16:
      bits[0] = 10;
      bits[1] = 10;
      shiftBits[0] = 6;
      shiftBits[1] = 6;
      shiftBits[2] = 6;
      shiftBits[3] = 6;
      break;
    case VK_FORMAT_B10X6G10X6R10X6G10X6_422_UNORM_4PACK16:
      bits[0] = 10;
      bits[1] = 10;
      shiftBits[0] = 6;
      shiftBits[1] = 6;
      shiftBits[2] = 6;
      shiftBits[3] = 6;
      goto LAB_001d1e8c;
    case VK_FORMAT_R12X4_UNORM_PACK16:
      bits[0] = 0xc;
      shiftBits[0] = 4;
LAB_001d1e33:
      channels = (int  [2])((ulong)channels & 0xffffffff00000000);
      iVar3 = 1;
LAB_001d1f98:
      puVar1 = createDFDPackedShifted(0,iVar3,bits,shiftBits,channels,s_UNORM);
      return puVar1;
    case VK_FORMAT_R12X4G12X4_UNORM_2PACK16:
      bits[0] = 0xc;
      bits[1] = 0xc;
      shiftBits[0] = 4;
      shiftBits[1] = 4;
LAB_001d1ef2:
      channels[0] = 0;
      channels[1] = 1;
      iVar3 = 2;
      goto LAB_001d1f98;
    case VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16:
      bits[0] = 0xc;
      bits[1] = 0xc;
      shiftBits[0] = 4;
      shiftBits[1] = 4;
      shiftBits[2] = 4;
      shiftBits[3] = 4;
LAB_001d1f89:
      channels[0] = 0;
      channels[1] = 1;
      iVar3 = 4;
      goto LAB_001d1f98;
    case VK_FORMAT_G12X4B12X4G12X4R12X4_422_UNORM_4PACK16:
      bits[0] = 0xc;
      bits[1] = 0xc;
      shiftBits[0] = 4;
      shiftBits[1] = 4;
      shiftBits[2] = 4;
      shiftBits[3] = 4;
      break;
    case VK_FORMAT_B12X4G12X4R12X4G12X4_422_UNORM_4PACK16:
      bits[0] = 0xc;
      bits[1] = 0xc;
      shiftBits[0] = 4;
      shiftBits[1] = 4;
      shiftBits[2] = 4;
      shiftBits[3] = 4;
      goto LAB_001d1e8c;
    case VK_FORMAT_G16B16G16R16_422_UNORM:
      bits[0] = 0x10;
      bits[1] = 0x10;
LAB_001d1f1d:
      shiftBits[0] = 0;
      shiftBits[1] = 0;
      shiftBits[2] = 0;
      shiftBits[3] = 0;
      break;
    case VK_FORMAT_B16G16R16G16_422_UNORM:
      bits[0] = 0x10;
      bits[1] = 0x10;
LAB_001d1e08:
      shiftBits[0] = 0;
      shiftBits[1] = 0;
      shiftBits[2] = 0;
      shiftBits[3] = 0;
LAB_001d1e8c:
      channels[0] = 1;
      channels[1] = 0;
      position_xs[2] = 0x40;
      position_xs[3] = 0xc0;
      goto LAB_001d1f35;
    }
    channels[0] = 0;
    channels[1] = 1;
    position_xs[2] = 0xc0;
    position_xs[3] = 0x40;
LAB_001d1f35:
    position_xs[0] = 0x40;
    position_xs[1] = 0x40;
    position_ys[0] = 0x80;
    position_ys[1] = 0x80;
    position_ys[2] = 0x80;
    position_ys[3] = 0x80;
    puVar1 = createDFD422(0,4,bits,shiftBits,channels,position_xs,position_ys,s_UNORM);
    return puVar1;
  }
  switch(format) {
  case VK_FORMAT_R4G4_UNORM_PACK8:
    channels[0] = 1;
    channels[1] = 0;
    bits[0] = 4;
    bits[1] = 4;
    iVar3 = 2;
    goto LAB_001d0fb2;
  case VK_FORMAT_R4G4B4A4_UNORM_PACK16:
    channels[0] = 3;
    channels[1] = 2;
    goto LAB_001d0f7e;
  case VK_FORMAT_B4G4R4A4_UNORM_PACK16:
    channels[0] = 3;
    channels[1] = 0;
LAB_001d0f7e:
    bits[0] = 4;
    bits[1] = 4;
    goto LAB_001d0fa5;
  case VK_FORMAT_R5G6B5_UNORM_PACK16:
    channels[0] = 2;
    channels[1] = 1;
    goto LAB_001d10dd;
  case VK_FORMAT_B5G6R5_UNORM_PACK16:
    channels[0] = 0;
    channels[1] = 1;
LAB_001d10dd:
    bits[0] = 5;
    bits[1] = 6;
    iVar3 = 3;
    goto LAB_001d0fb2;
  case VK_FORMAT_R5G5B5A1_UNORM_PACK16:
    channels[1] = 2;
    goto LAB_001d1cb4;
  case VK_FORMAT_B5G5R5A1_UNORM_PACK16:
    channels[1] = 0;
LAB_001d1cb4:
    channels[0] = 3;
    bits[0] = 1;
    bits[1] = 5;
    goto LAB_001d0fa5;
  case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
    channels[0] = 2;
LAB_001d0f96:
    channels[1] = 1;
    bits[0] = 5;
    bits[1] = 5;
    goto LAB_001d0fa5;
  case VK_FORMAT_R8_UNORM:
    iVar5 = 1;
    goto LAB_001d127e;
  case VK_FORMAT_R8_SNORM:
    iVar5 = 1;
    goto LAB_001d1c30;
  case VK_FORMAT_R8_USCALED:
    iVar5 = 1;
    goto LAB_001d1a6a;
  case VK_FORMAT_R8_SSCALED:
    iVar5 = 1;
    goto LAB_001d1d1a;
  case VK_FORMAT_R8_UINT:
    iVar5 = 1;
    goto LAB_001d1ce5;
  case VK_FORMAT_R8_SINT:
    iVar5 = 1;
    goto LAB_001d1d04;
  case VK_FORMAT_R8_SRGB:
    iVar5 = 1;
    goto LAB_001d1c5b;
  case VK_FORMAT_R8G8_UNORM:
    iVar5 = 2;
    goto LAB_001d127e;
  case VK_FORMAT_R8G8_SNORM:
    iVar5 = 2;
    goto LAB_001d1c30;
  case VK_FORMAT_R8G8_USCALED:
    iVar5 = 2;
    goto LAB_001d1a6a;
  case VK_FORMAT_R8G8_SSCALED:
    iVar5 = 2;
    goto LAB_001d1d1a;
  case VK_FORMAT_R8G8_UINT:
    iVar5 = 2;
    goto LAB_001d1ce5;
  case VK_FORMAT_R8G8_SINT:
    iVar5 = 2;
    goto LAB_001d1d04;
  case VK_FORMAT_R8G8_SRGB:
    iVar5 = 2;
    goto LAB_001d1c5b;
  case VK_FORMAT_R8G8B8_UNORM:
    iVar5 = 3;
    goto LAB_001d127e;
  case VK_FORMAT_R8G8B8_SNORM:
    iVar5 = 3;
    goto LAB_001d1c30;
  case VK_FORMAT_R8G8B8_USCALED:
    iVar5 = 3;
    goto LAB_001d1a6a;
  case VK_FORMAT_R8G8B8_SSCALED:
    iVar5 = 3;
    goto LAB_001d1d1a;
  case VK_FORMAT_R8G8B8_UINT:
    iVar5 = 3;
    goto LAB_001d1ce5;
  case VK_FORMAT_R8G8B8_SINT:
    iVar5 = 3;
    goto LAB_001d1d04;
  case VK_FORMAT_R8G8B8_SRGB:
    iVar5 = 3;
    goto LAB_001d1c5b;
  case VK_FORMAT_B8G8R8_UNORM:
    iVar5 = 3;
    goto LAB_001d1ccf;
  case VK_FORMAT_B8G8R8_SNORM:
    iVar5 = 3;
    goto LAB_001d15a9;
  case VK_FORMAT_B8G8R8_USCALED:
    iVar5 = 3;
    goto LAB_001d1224;
  case VK_FORMAT_B8G8R8_SSCALED:
    iVar5 = 3;
    goto LAB_001d129b;
  case VK_FORMAT_B8G8R8_UINT:
    iVar5 = 3;
    goto LAB_001d1a8f;
  case VK_FORMAT_B8G8R8_SINT:
    iVar5 = 3;
    goto LAB_001d138e;
  case VK_FORMAT_B8G8R8_SRGB:
    iVar5 = 3;
    goto LAB_001d1bfa;
  case VK_FORMAT_R8G8B8A8_UNORM:
    iVar5 = 4;
LAB_001d127e:
    iVar4 = 1;
LAB_001d1be9:
    iVar3 = 0;
LAB_001d1beb:
    VVar6 = s_UNORM;
LAB_001d1d27:
    puVar1 = createDFDUnpacked(0,iVar5,iVar4,iVar3,VVar6);
    return puVar1;
  case VK_FORMAT_R8G8B8A8_SNORM:
    iVar5 = 4;
LAB_001d1c30:
    iVar4 = 1;
LAB_001d1c94:
    iVar3 = 0;
LAB_001d1c96:
    VVar6 = s_SNORM;
    goto LAB_001d1d27;
  case VK_FORMAT_R8G8B8A8_USCALED:
    iVar5 = 4;
LAB_001d1a6a:
    iVar4 = 1;
LAB_001d1a6f:
    iVar3 = 0;
LAB_001d1a71:
    VVar6 = s_USCALED;
    goto LAB_001d1d27;
  case VK_FORMAT_R8G8B8A8_SSCALED:
    iVar5 = 4;
LAB_001d1d1a:
    iVar4 = 1;
LAB_001d1d1f:
    iVar3 = 0;
LAB_001d1d21:
    VVar6 = s_SSCALED;
    goto LAB_001d1d27;
  case VK_FORMAT_R8G8B8A8_UINT:
    iVar5 = 4;
LAB_001d1ce5:
    iVar4 = 1;
LAB_001d1cea:
    iVar3 = 0;
LAB_001d1cec:
    VVar6 = s_UINT;
    goto LAB_001d1d27;
  case VK_FORMAT_R8G8B8A8_SINT:
    iVar5 = 4;
LAB_001d1d04:
    iVar4 = 1;
LAB_001d1d09:
    iVar3 = 0;
LAB_001d1d0b:
    VVar6 = s_SINT;
    goto LAB_001d1d27;
  case VK_FORMAT_R8G8B8A8_SRGB:
    iVar5 = 4;
LAB_001d1c5b:
    iVar3 = 0;
LAB_001d1c62:
    iVar4 = 1;
    VVar6 = s_SRGB;
    goto LAB_001d1d27;
  case VK_FORMAT_B8G8R8A8_UNORM:
    iVar5 = 4;
LAB_001d1ccf:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001d1beb;
  case VK_FORMAT_B8G8R8A8_SNORM:
    iVar5 = 4;
LAB_001d15a9:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001d1c96;
  case VK_FORMAT_B8G8R8A8_USCALED:
    iVar5 = 4;
LAB_001d1224:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001d1a71;
  case VK_FORMAT_B8G8R8A8_SSCALED:
    iVar5 = 4;
LAB_001d129b:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001d1d21;
  case VK_FORMAT_B8G8R8A8_UINT:
    iVar5 = 4;
LAB_001d1a8f:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001d1cec;
  case VK_FORMAT_B8G8R8A8_SINT:
    iVar5 = 4;
LAB_001d138e:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001d1d0b;
  case VK_FORMAT_B8G8R8A8_SRGB:
    iVar5 = 4;
LAB_001d1bfa:
    iVar3 = 1;
    goto LAB_001d1c62;
  case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001d0fa5;
  case VK_FORMAT_A8B8G8R8_SNORM_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001d195c;
  case VK_FORMAT_A8B8G8R8_USCALED_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001d1ae9;
  case VK_FORMAT_A8B8G8R8_SSCALED_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001d141f;
  case VK_FORMAT_A8B8G8R8_UINT_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001d1a26;
  case VK_FORMAT_A8B8G8R8_SINT_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001d192e;
  case VK_FORMAT_A8B8G8R8_SRGB_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    channels_00 = channels;
    bits[0] = 8;
    bits[1] = 8;
    iVar3 = 4;
    VVar6 = s_SRGB;
    goto LAB_001d0fb5;
  case VK_FORMAT_A2R10G10B10_UNORM_PACK32:
    channels[0] = 2;
    goto LAB_001d18b6;
  case VK_FORMAT_A2R10G10B10_SNORM_PACK32:
    channels[0] = 2;
    goto LAB_001d194d;
  case VK_FORMAT_A2R10G10B10_USCALED_PACK32:
    channels[0] = 2;
    goto LAB_001d1ada;
  case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:
    channels[0] = 2;
    goto LAB_001d1410;
  case VK_FORMAT_A2R10G10B10_UINT_PACK32:
    channels[0] = 2;
    goto LAB_001d1a17;
  case VK_FORMAT_A2R10G10B10_SINT_PACK32:
    channels[0] = 2;
    goto LAB_001d191f;
  case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
    channels[0] = 0;
LAB_001d18b6:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001d0fa5:
    iVar3 = 4;
LAB_001d0fb2:
    channels_00 = channels;
    VVar6 = s_UNORM;
    bits_00 = bits;
LAB_001d0fb5:
    puVar1 = createDFDPacked(0,iVar3,bits_00,channels_00,VVar6);
switchD_001d0ff1_default:
    return puVar1;
  case VK_FORMAT_A2B10G10R10_SNORM_PACK32:
    channels[0] = 0;
LAB_001d194d:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001d195c:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_SNORM;
    bits_00 = bits;
    goto LAB_001d0fb5;
  case VK_FORMAT_A2B10G10R10_USCALED_PACK32:
    channels[0] = 0;
LAB_001d1ada:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001d1ae9:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_USCALED;
    bits_00 = bits;
    goto LAB_001d0fb5;
  case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:
    channels[0] = 0;
LAB_001d1410:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001d141f:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_SSCALED;
    bits_00 = bits;
    goto LAB_001d0fb5;
  case VK_FORMAT_A2B10G10R10_UINT_PACK32:
    channels[0] = 0;
LAB_001d1a17:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001d1a26:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_UINT;
    bits_00 = bits;
    goto LAB_001d0fb5;
  case VK_FORMAT_A2B10G10R10_SINT_PACK32:
    channels[0] = 0;
LAB_001d191f:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001d192e:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_SINT;
    bits_00 = bits;
    goto LAB_001d0fb5;
  case VK_FORMAT_R16_UNORM:
    iVar5 = 1;
    goto LAB_001d1be4;
  case VK_FORMAT_R16_SNORM:
    iVar5 = 1;
    goto LAB_001d1c8f;
  case VK_FORMAT_R16_USCALED:
    iVar5 = 1;
    goto LAB_001d197b;
  case VK_FORMAT_R16_SSCALED:
    iVar5 = 1;
    goto LAB_001d1c3e;
  case VK_FORMAT_R16_UINT:
    iVar5 = 1;
    goto LAB_001d1c16;
  case VK_FORMAT_R16_SINT:
    iVar5 = 1;
    goto LAB_001d1bd3;
  case VK_FORMAT_R16_SFLOAT:
    iVar5 = 1;
    goto LAB_001d1b9d;
  case VK_FORMAT_R16G16_UNORM:
    iVar5 = 2;
    goto LAB_001d1be4;
  case VK_FORMAT_R16G16_SNORM:
    iVar5 = 2;
    goto LAB_001d1c8f;
  case VK_FORMAT_R16G16_USCALED:
    iVar5 = 2;
    goto LAB_001d197b;
  case VK_FORMAT_R16G16_SSCALED:
    iVar5 = 2;
    goto LAB_001d1c3e;
  case VK_FORMAT_R16G16_UINT:
    iVar5 = 2;
    goto LAB_001d1c16;
  case VK_FORMAT_R16G16_SINT:
    iVar5 = 2;
    goto LAB_001d1bd3;
  case VK_FORMAT_R16G16_SFLOAT:
    iVar5 = 2;
    goto LAB_001d1b9d;
  case VK_FORMAT_R16G16B16_UNORM:
    iVar5 = 3;
    goto LAB_001d1be4;
  case VK_FORMAT_R16G16B16_SNORM:
    iVar5 = 3;
    goto LAB_001d1c8f;
  case VK_FORMAT_R16G16B16_USCALED:
    iVar5 = 3;
    goto LAB_001d197b;
  case VK_FORMAT_R16G16B16_SSCALED:
    iVar5 = 3;
    goto LAB_001d1c3e;
  case VK_FORMAT_R16G16B16_UINT:
    iVar5 = 3;
    goto LAB_001d1c16;
  case VK_FORMAT_R16G16B16_SINT:
    iVar5 = 3;
    goto LAB_001d1bd3;
  case VK_FORMAT_R16G16B16_SFLOAT:
    iVar5 = 3;
    goto LAB_001d1b9d;
  case VK_FORMAT_R16G16B16A16_UNORM:
    iVar5 = 4;
LAB_001d1be4:
    iVar4 = 2;
    goto LAB_001d1be9;
  case VK_FORMAT_R16G16B16A16_SNORM:
    iVar5 = 4;
LAB_001d1c8f:
    iVar4 = 2;
    goto LAB_001d1c94;
  case VK_FORMAT_R16G16B16A16_USCALED:
    iVar5 = 4;
LAB_001d197b:
    iVar4 = 2;
    goto LAB_001d1a6f;
  case VK_FORMAT_R16G16B16A16_SSCALED:
    iVar5 = 4;
LAB_001d1c3e:
    iVar4 = 2;
    goto LAB_001d1d1f;
  case VK_FORMAT_R16G16B16A16_UINT:
    iVar5 = 4;
LAB_001d1c16:
    iVar4 = 2;
    goto LAB_001d1cea;
  case VK_FORMAT_R16G16B16A16_SINT:
    iVar5 = 4;
LAB_001d1bd3:
    iVar4 = 2;
    goto LAB_001d1d09;
  case VK_FORMAT_R16G16B16A16_SFLOAT:
    iVar5 = 4;
LAB_001d1b9d:
    iVar4 = 2;
LAB_001d1ba2:
    iVar3 = 0;
    VVar6 = s_SFLOAT;
    goto LAB_001d1d27;
  case VK_FORMAT_R32_UINT:
    iVar5 = 1;
    goto LAB_001d190e;
  case VK_FORMAT_R32_SINT:
    iVar5 = 1;
    goto LAB_001d18e9;
  case VK_FORMAT_R32_SFLOAT:
    iVar5 = 1;
    goto LAB_001d1b8f;
  case VK_FORMAT_R32G32_UINT:
    iVar5 = 2;
    goto LAB_001d190e;
  case VK_FORMAT_R32G32_SINT:
    iVar5 = 2;
    goto LAB_001d18e9;
  case VK_FORMAT_R32G32_SFLOAT:
    iVar5 = 2;
    goto LAB_001d1b8f;
  case VK_FORMAT_R32G32B32_UINT:
    iVar5 = 3;
    goto LAB_001d190e;
  case VK_FORMAT_R32G32B32_SINT:
    iVar5 = 3;
    goto LAB_001d18e9;
  case VK_FORMAT_R32G32B32_SFLOAT:
    iVar5 = 3;
    goto LAB_001d1b8f;
  case VK_FORMAT_R32G32B32A32_UINT:
    iVar5 = 4;
LAB_001d190e:
    iVar4 = 4;
    goto LAB_001d1cea;
  case VK_FORMAT_R32G32B32A32_SINT:
    iVar5 = 4;
LAB_001d18e9:
    iVar4 = 4;
    goto LAB_001d1d09;
  case VK_FORMAT_R32G32B32A32_SFLOAT:
    iVar5 = 4;
LAB_001d1b8f:
    iVar4 = 4;
    goto LAB_001d1ba2;
  case VK_FORMAT_R64_UINT:
    iVar5 = 1;
    goto LAB_001d1bb6;
  case VK_FORMAT_R64_SINT:
    iVar5 = 1;
    goto LAB_001d1b28;
  case VK_FORMAT_R64_SFLOAT:
    iVar5 = 1;
    goto LAB_001d1aa5;
  case VK_FORMAT_R64G64_UINT:
    iVar5 = 2;
    goto LAB_001d1bb6;
  case VK_FORMAT_R64G64_SINT:
    iVar5 = 2;
    goto LAB_001d1b28;
  case VK_FORMAT_R64G64_SFLOAT:
    iVar5 = 2;
    goto LAB_001d1aa5;
  case VK_FORMAT_R64G64B64_UINT:
    iVar5 = 3;
    goto LAB_001d1bb6;
  case VK_FORMAT_R64G64B64_SINT:
    iVar5 = 3;
    goto LAB_001d1b28;
  case VK_FORMAT_R64G64B64_SFLOAT:
    iVar5 = 3;
    goto LAB_001d1aa5;
  case VK_FORMAT_R64G64B64A64_UINT:
    iVar5 = 4;
LAB_001d1bb6:
    iVar4 = 8;
    goto LAB_001d1cea;
  case VK_FORMAT_R64G64B64A64_SINT:
    iVar5 = 4;
LAB_001d1b28:
    iVar4 = 8;
    goto LAB_001d1d09;
  case VK_FORMAT_R64G64B64A64_SFLOAT:
    iVar5 = 4;
LAB_001d1aa5:
    iVar4 = 8;
    goto LAB_001d1ba2;
  case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
    channels_00 = channels;
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 0xb;
    bits[1] = 0xb;
    iVar3 = 3;
    goto LAB_001d1761;
  case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
    piVar2 = channels;
    channels = (int  [2])((ulong)channels & 0xffffffff00000000);
    bits = (int  [2])((ulong)bits & 0xffffffff00000000);
    iVar3 = 6;
LAB_001d1761:
    VVar6 = s_UFLOAT;
    bits_00 = piVar2;
    goto LAB_001d0fb5;
  case VK_FORMAT_D16_UNORM:
    iVar5 = 0x10;
    iVar4 = 0;
    iVar3 = 2;
    goto LAB_001d1abe;
  case VK_FORMAT_X8_D24_UNORM_PACK32:
    iVar5 = 0x18;
    goto LAB_001d19cc;
  case VK_FORMAT_D32_SFLOAT:
    iVar5 = 0x20;
LAB_001d19cc:
    iVar4 = 0;
LAB_001d1ab9:
    iVar3 = 4;
    goto LAB_001d1abe;
  case VK_FORMAT_S8_UINT:
    iVar5 = 0;
    iVar4 = 8;
    iVar3 = 1;
    goto LAB_001d1abe;
  case VK_FORMAT_D16_UNORM_S8_UINT:
    iVar5 = 0x10;
    goto LAB_001d1ab4;
  case VK_FORMAT_D24_UNORM_S8_UINT:
    iVar5 = 0x18;
LAB_001d1ab4:
    iVar4 = 8;
    goto LAB_001d1ab9;
  case VK_FORMAT_D32_SFLOAT_S8_UINT:
    iVar5 = 0x20;
    iVar4 = 8;
    iVar3 = 8;
LAB_001d1abe:
    puVar1 = createDFDDepthStencil(iVar5,iVar4,iVar3);
    return puVar1;
  case VK_FORMAT_BC1_RGB_UNORM_BLOCK:
    compScheme = c_BC1_RGB;
    break;
  case VK_FORMAT_BC1_RGB_SRGB_BLOCK:
    compScheme = c_BC1_RGB;
    goto LAB_001d1b0a;
  case VK_FORMAT_BC1_RGBA_UNORM_BLOCK:
    compScheme = c_BC1_RGBA;
    break;
  case VK_FORMAT_BC1_RGBA_SRGB_BLOCK:
    compScheme = c_BC1_RGBA;
    goto LAB_001d1b0a;
  case VK_FORMAT_BC2_UNORM_BLOCK:
    compScheme = c_BC2;
    break;
  case VK_FORMAT_BC2_SRGB_BLOCK:
    compScheme = c_BC2;
    goto LAB_001d1b0a;
  case VK_FORMAT_BC3_UNORM_BLOCK:
    compScheme = c_BC3;
    break;
  case VK_FORMAT_BC3_SRGB_BLOCK:
    compScheme = c_BC3;
    goto LAB_001d1b0a;
  case VK_FORMAT_BC4_UNORM_BLOCK:
    compScheme = c_BC4;
    break;
  case VK_FORMAT_BC4_SNORM_BLOCK:
    compScheme = c_BC4;
    goto LAB_001d19ec;
  case VK_FORMAT_BC5_UNORM_BLOCK:
    compScheme = c_BC5;
    break;
  case VK_FORMAT_BC5_SNORM_BLOCK:
    compScheme = c_BC5;
    goto LAB_001d19ec;
  case VK_FORMAT_BC6H_UFLOAT_BLOCK:
    compScheme = c_BC6H;
    iVar5 = 4;
    iVar4 = 4;
    iVar3 = 1;
    VVar6 = s_UFLOAT;
    goto LAB_001d1b73;
  case VK_FORMAT_BC6H_SFLOAT_BLOCK:
    compScheme = c_BC6H;
LAB_001d14cb:
    iVar5 = 4;
LAB_001d1663:
    iVar4 = 4;
    goto LAB_001d1844;
  case VK_FORMAT_BC7_UNORM_BLOCK:
    compScheme = c_BC7;
    break;
  case VK_FORMAT_BC7_SRGB_BLOCK:
    compScheme = c_BC7;
    goto LAB_001d1b0a;
  case VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK:
    compScheme = c_ETC2_R8G8B8;
    break;
  case VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK:
    compScheme = c_ETC2_R8G8B8;
    goto LAB_001d1b0a;
  case VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK:
    compScheme = c_ETC2_R8G8B8A1;
    break;
  case VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK:
    compScheme = c_ETC2_R8G8B8A1;
    goto LAB_001d1b0a;
  case VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK:
    compScheme = c_ETC2_R8G8B8A8;
    break;
  case VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK:
    compScheme = c_ETC2_R8G8B8A8;
    goto LAB_001d1b0a;
  case VK_FORMAT_EAC_R11_UNORM_BLOCK:
    compScheme = c_EAC_R11;
    break;
  case VK_FORMAT_EAC_R11_SNORM_BLOCK:
    compScheme = c_EAC_R11;
    goto LAB_001d19ec;
  case VK_FORMAT_EAC_R11G11_UNORM_BLOCK:
    compScheme = c_EAC_R11G11;
    break;
  case VK_FORMAT_EAC_R11G11_SNORM_BLOCK:
    compScheme = c_EAC_R11G11;
LAB_001d19ec:
    iVar5 = 4;
    iVar4 = 4;
    iVar3 = 1;
    VVar6 = s_SNORM;
    goto LAB_001d1b73;
  case VK_FORMAT_ASTC_4x4_UNORM_BLOCK:
    compScheme = c_ASTC;
    break;
  case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
    compScheme = c_ASTC;
LAB_001d1b0a:
    iVar5 = 4;
LAB_001d1b0f:
    iVar4 = 4;
LAB_001d1b14:
    iVar3 = 1;
LAB_001d1b19:
    VVar6 = s_SRGB;
    goto LAB_001d1b73;
  case VK_FORMAT_ASTC_5x4_UNORM_BLOCK:
    compScheme = c_ASTC;
    iVar5 = 5;
    goto LAB_001d1b66;
  case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
    compScheme = c_ASTC;
    iVar5 = 5;
    goto LAB_001d1b0f;
  case VK_FORMAT_ASTC_5x5_UNORM_BLOCK:
    iVar5 = 5;
    goto LAB_001d19dd;
  case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
    iVar5 = 5;
    goto LAB_001d18fd;
  case VK_FORMAT_ASTC_6x5_UNORM_BLOCK:
    iVar5 = 6;
    goto LAB_001d19dd;
  case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
    iVar5 = 6;
    goto LAB_001d18fd;
  case VK_FORMAT_ASTC_6x6_UNORM_BLOCK:
    iVar5 = 6;
    goto LAB_001d19a5;
  case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
    iVar5 = 6;
    goto LAB_001d1810;
  case VK_FORMAT_ASTC_8x5_UNORM_BLOCK:
    iVar5 = 8;
    goto LAB_001d19dd;
  case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
    iVar5 = 8;
    goto LAB_001d18fd;
  case VK_FORMAT_ASTC_8x6_UNORM_BLOCK:
    iVar5 = 8;
    goto LAB_001d19a5;
  case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
    iVar5 = 8;
    goto LAB_001d1810;
  case VK_FORMAT_ASTC_8x8_UNORM_BLOCK:
    iVar5 = 8;
    goto LAB_001d179e;
  case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
    iVar5 = 8;
    goto LAB_001d17c6;
  case VK_FORMAT_ASTC_10x5_UNORM_BLOCK:
    iVar5 = 10;
LAB_001d19dd:
    compScheme = c_ASTC;
    iVar4 = 5;
    goto LAB_001d1b6b;
  case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
    iVar5 = 10;
LAB_001d18fd:
    compScheme = c_ASTC;
    iVar4 = 5;
    goto LAB_001d1b14;
  case VK_FORMAT_ASTC_10x6_UNORM_BLOCK:
    iVar5 = 10;
LAB_001d19a5:
    compScheme = c_ASTC;
    iVar4 = 6;
    goto LAB_001d1b6b;
  case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
    iVar5 = 10;
LAB_001d1810:
    compScheme = c_ASTC;
    iVar4 = 6;
    goto LAB_001d1b14;
  case VK_FORMAT_ASTC_10x8_UNORM_BLOCK:
    iVar5 = 10;
LAB_001d179e:
    compScheme = c_ASTC;
    iVar4 = 8;
    goto LAB_001d1b6b;
  case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
    iVar5 = 10;
LAB_001d17c6:
    compScheme = c_ASTC;
    iVar4 = 8;
    goto LAB_001d1b14;
  case VK_FORMAT_ASTC_10x10_UNORM_BLOCK:
    iVar5 = 10;
    goto LAB_001d1714;
  case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
    iVar5 = 10;
    goto LAB_001d1589;
  case VK_FORMAT_ASTC_12x10_UNORM_BLOCK:
    iVar5 = 0xc;
LAB_001d1714:
    compScheme = c_ASTC;
    iVar4 = 10;
    goto LAB_001d1b6b;
  case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
    iVar5 = 0xc;
LAB_001d1589:
    compScheme = c_ASTC;
    iVar4 = 10;
    goto LAB_001d1b14;
  case VK_FORMAT_ASTC_12x12_UNORM_BLOCK:
    compScheme = c_ASTC;
    iVar5 = 0xc;
    iVar4 = 0xc;
    goto LAB_001d1b6b;
  case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
    compScheme = c_ASTC;
    iVar5 = 0xc;
    iVar4 = 0xc;
    goto LAB_001d1b14;
  default:
    switch(format) {
    case VK_FORMAT_ASTC_4x4_SFLOAT_BLOCK:
      compScheme = c_ASTC;
      goto LAB_001d14cb;
    case VK_FORMAT_ASTC_5x4_SFLOAT_BLOCK:
      compScheme = c_ASTC;
      iVar5 = 5;
      goto LAB_001d1663;
    case VK_FORMAT_ASTC_5x5_SFLOAT_BLOCK:
      iVar5 = 5;
      break;
    case VK_FORMAT_ASTC_6x5_SFLOAT_BLOCK:
      iVar5 = 6;
      break;
    case VK_FORMAT_ASTC_6x6_SFLOAT_BLOCK:
      iVar5 = 6;
      goto LAB_001d17f0;
    case VK_FORMAT_ASTC_8x5_SFLOAT_BLOCK:
      iVar5 = 8;
      break;
    case VK_FORMAT_ASTC_8x6_SFLOAT_BLOCK:
      iVar5 = 8;
      goto LAB_001d17f0;
    case VK_FORMAT_ASTC_8x8_SFLOAT_BLOCK:
      iVar5 = 8;
      goto LAB_001d182e;
    case VK_FORMAT_ASTC_10x5_SFLOAT_BLOCK:
      iVar5 = 10;
      break;
    case VK_FORMAT_ASTC_10x6_SFLOAT_BLOCK:
      iVar5 = 10;
LAB_001d17f0:
      compScheme = c_ASTC;
      iVar4 = 6;
      goto LAB_001d1844;
    case VK_FORMAT_ASTC_10x8_SFLOAT_BLOCK:
      iVar5 = 10;
LAB_001d182e:
      compScheme = c_ASTC;
      iVar4 = 8;
      goto LAB_001d1844;
    case VK_FORMAT_ASTC_10x10_SFLOAT_BLOCK:
      iVar5 = 10;
      goto LAB_001d1539;
    case VK_FORMAT_ASTC_12x10_SFLOAT_BLOCK:
      iVar5 = 0xc;
LAB_001d1539:
      compScheme = c_ASTC;
      iVar4 = 10;
      goto LAB_001d1844;
    case VK_FORMAT_ASTC_12x12_SFLOAT_BLOCK:
      compScheme = c_ASTC;
      iVar5 = 0xc;
      iVar4 = 0xc;
      goto LAB_001d1844;
    default:
      switch(format) {
      case VK_FORMAT_PVRTC1_2BPP_UNORM_BLOCK_IMG:
        compScheme = c_PVRTC;
        goto LAB_001d168a;
      case VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG:
        compScheme = c_PVRTC;
        break;
      case VK_FORMAT_PVRTC2_2BPP_UNORM_BLOCK_IMG:
        compScheme = c_PVRTC2;
LAB_001d168a:
        iVar5 = 8;
        goto LAB_001d1b66;
      case VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG:
        compScheme = c_PVRTC2;
        break;
      case VK_FORMAT_PVRTC1_2BPP_SRGB_BLOCK_IMG:
        compScheme = c_PVRTC;
        goto LAB_001d1877;
      case VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG:
        compScheme = c_PVRTC;
        goto LAB_001d1b0a;
      case VK_FORMAT_PVRTC2_2BPP_SRGB_BLOCK_IMG:
        compScheme = c_PVRTC2;
LAB_001d1877:
        iVar5 = 8;
        goto LAB_001d1b0f;
      case VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG:
        compScheme = c_PVRTC2;
        goto LAB_001d1b0a;
      default:
        goto switchD_001d0ff1_default;
      }
      goto LAB_001d1b61;
    }
    compScheme = c_ASTC;
    iVar4 = 5;
LAB_001d1844:
    iVar3 = 1;
LAB_001d1849:
    VVar6 = s_SFLOAT;
    goto LAB_001d1b73;
  }
LAB_001d1b61:
  iVar5 = 4;
LAB_001d1b66:
  iVar4 = 4;
LAB_001d1b6b:
  iVar3 = 1;
LAB_001d1b70:
  VVar6 = s_UNORM;
LAB_001d1b73:
  puVar1 = createDFDCompressed(compScheme,iVar5,iVar4,iVar3,VVar6);
  return puVar1;
}

Assistant:

uint32_t*
vk2dfd(enum VkFormat format)
 {
     switch (format) {
#include "vk2dfd.inl"
         default: return 0;
     }
 }